

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartsBupOutputter.cpp
# Opt level: O1

ssize_t __thiscall PartsBupOutputter::write(PartsBupOutputter *this,int __fd,void *__buf,size_t __n)

{
  pointer *ppIVar1;
  pointer this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer ppVar4;
  iterator __position;
  pointer pIVar5;
  reference pvVar6;
  reference extraout_RAX;
  reference extraout_RAX_00;
  ostream *poVar7;
  anon_class_8_1_8991fb9c path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  anon_class_8_1_8991fb9c local_38;
  
  ppVar4 = (this->expressions).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __position._M_current =
       ppVar4[-1].second.
       super__Vector_base<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      ppVar4[-1].second.
      super__Vector_base<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>::
    _M_realloc_insert<>(&ppVar4[-1].second,__position);
  }
  else {
    ((__position._M_current)->parts).
    super__Vector_base<std::pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    *(undefined8 *)&(__position._M_current)->color = 0;
    ((__position._M_current)->parts).
    super__Vector_base<std::pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ((__position._M_current)->parts).
    super__Vector_base<std::pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ppIVar1 = &ppVar4[-1].second.
               super__Vector_base<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppIVar1 = *ppIVar1 + 1;
  }
  pIVar5 = (this->expressions).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].second.
           super__Vector_base<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = pIVar5 + -1;
  local_38.this = this;
  write::anon_class_8_1_8991fb9c::operator()(&local_80,&local_38,&this->baseName);
  paVar2 = &local_60.second.field_2;
  local_60.first.x = 0;
  local_60.first.y = 0;
  paVar3 = &local_80.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p == paVar3) {
    local_60.second.field_2._8_8_ = local_80.field_2._8_8_;
    local_60.second._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_60.second._M_dataplus._M_p = local_80._M_dataplus._M_p;
  }
  local_60.second.field_2._M_allocated_capacity._1_7_ = local_80.field_2._M_allocated_capacity._1_7_
  ;
  local_60.second.field_2._M_local_buf[0] = local_80.field_2._M_local_buf[0];
  local_60.second._M_string_length = local_80._M_string_length;
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  local_80._M_dataplus._M_p = (pointer)paVar3;
  pvVar6 = std::
           vector<std::pair<Point,std::__cxx11::string>,std::allocator<std::pair<Point,std::__cxx11::string>>>
           ::emplace_back<std::pair<Point,std::__cxx11::string>>
                     ((vector<std::pair<Point,std::__cxx11::string>,std::allocator<std::pair<Point,std::__cxx11::string>>>
                       *)this_00,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.second._M_dataplus._M_p != paVar2) {
    operator_delete(local_60.second._M_dataplus._M_p,
                    local_60.second.field_2._M_allocated_capacity + 1);
    pvVar6 = extraout_RAX;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar3) {
    operator_delete(local_80._M_dataplus._M_p,
                    CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                             local_80.field_2._M_local_buf[0]) + 1);
    pvVar6 = extraout_RAX_00;
  }
  if ((this->withFaceName)._M_string_length != 0) {
    write::anon_class_8_1_8991fb9c::operator()(&local_80,&local_38,&this->withFaceName);
    local_60.first = this->facePos;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == paVar3) {
      local_60.second.field_2._8_8_ = local_80.field_2._8_8_;
      local_60.second._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_60.second._M_dataplus._M_p = local_80._M_dataplus._M_p;
    }
    local_60.second.field_2._M_allocated_capacity._1_7_ =
         local_80.field_2._M_allocated_capacity._1_7_;
    local_60.second.field_2._M_local_buf[0] = local_80.field_2._M_local_buf[0];
    local_60.second._M_string_length = local_80._M_string_length;
    local_80._M_string_length = 0;
    local_80.field_2._M_local_buf[0] = '\0';
    local_80._M_dataplus._M_p = (pointer)paVar3;
    std::
    vector<std::pair<Point,std::__cxx11::string>,std::allocator<std::pair<Point,std::__cxx11::string>>>
    ::emplace_back<std::pair<Point,std::__cxx11::string>>
              ((vector<std::pair<Point,std::__cxx11::string>,std::allocator<std::pair<Point,std::__cxx11::string>>>
                *)this_00,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.second._M_dataplus._M_p != paVar2) {
      operator_delete(local_60.second._M_dataplus._M_p,
                      local_60.second.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar3) {
      operator_delete(local_80._M_dataplus._M_p,
                      CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                               local_80.field_2._M_local_buf[0]) + 1);
    }
    pvVar6 = (reference)(ulong)this->faceBlend;
    if ((pIVar5[-1].color == AlphaBlend) ||
       (pvVar6 = (reference)0x2, this->faceBlend == NotPossible)) {
      pIVar5[-1].color = (Blend)pvVar6;
    }
  }
  if ((this->withMouthName)._M_string_length != 0) {
    write::anon_class_8_1_8991fb9c::operator()(&local_80,&local_38,&this->withMouthName);
    local_60.first = this->mouthPos;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == paVar3) {
      local_60.second.field_2._8_8_ = local_80.field_2._8_8_;
      local_60.second._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_60.second._M_dataplus._M_p = local_80._M_dataplus._M_p;
    }
    local_60.second.field_2._M_allocated_capacity._1_7_ =
         local_80.field_2._M_allocated_capacity._1_7_;
    local_60.second.field_2._M_local_buf[0] = local_80.field_2._M_local_buf[0];
    local_60.second._M_string_length = local_80._M_string_length;
    local_80._M_string_length = 0;
    local_80.field_2._M_local_buf[0] = '\0';
    local_80._M_dataplus._M_p = (pointer)paVar3;
    std::
    vector<std::pair<Point,std::__cxx11::string>,std::allocator<std::pair<Point,std::__cxx11::string>>>
    ::emplace_back<std::pair<Point,std::__cxx11::string>>
              ((vector<std::pair<Point,std::__cxx11::string>,std::allocator<std::pair<Point,std::__cxx11::string>>>
                *)this_00,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.second._M_dataplus._M_p != paVar2) {
      operator_delete(local_60.second._M_dataplus._M_p,
                      local_60.second.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar3) {
      operator_delete(local_80._M_dataplus._M_p,
                      CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                               local_80.field_2._M_local_buf[0]) + 1);
    }
    pvVar6 = (reference)(ulong)this->mouthBlend;
    if ((pIVar5[-1].color == AlphaBlend) ||
       (pvVar6 = (reference)0x2, this->mouthBlend == NotPossible)) {
      pIVar5[-1].color = (Blend)pvVar6;
    }
  }
  if (pIVar5[-1].color == NotPossible) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Warning: ",9);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(this->withFaceName)._M_dataplus._M_p,
                        (this->withFaceName)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," has fully transparent overridden pixels, it may not be properly renderable",
               0x4b);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    pvVar6 = (reference)std::ostream::flush();
  }
  return (ssize_t)pvVar6;
}

Assistant:

void write() override {
		expressions.back().second.emplace_back();
		ImageEntry& cur = expressions.back().second.back();

		auto addColor = [&](Blend type){
			if (cur.color == Blend::AlphaBlend) {
				cur.color = type;
			} else if (type == Blend::NotPossible) {
				cur.color = type;
			}
		};
		auto path = [&](const std::string& name){
			return baseName + "/" + name + ".png";
		};

		cur.parts.push_back({{0, 0}, path(baseName)});
		if (!withFaceName.empty()) {
			cur.parts.push_back({facePos, path(withFaceName)});
			addColor(faceBlend);
		}
		if (!withMouthName.empty()) {
			cur.parts.push_back({mouthPos, path(withMouthName)});
			addColor(mouthBlend);
		}
		if (cur.color == Blend::NotPossible) {
			std::cerr << "Warning: " << withFaceName << " has fully transparent overridden pixels, it may not be properly renderable" << std::endl;
		}
	}